

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall
wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator::
visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  string_view *psVar1;
  Type right;
  Type left;
  ValidationInfo *pVVar2;
  bool bVar3;
  ostream *poVar4;
  Function *in_RCX;
  bool bVar5;
  string_view sVar6;
  pair<std::__detail::_Node_iterator<wasm::Expression_*,_true,_false>,_bool> pVar7;
  Name name;
  Name name_00;
  _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_200;
  ostringstream ss;
  ios_base local_190 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ostream *local_48;
  char local_39;
  Expression *local_38;
  Expression *curr_local;
  
  psVar1 = *(string_view **)((long)this + 200);
  local_38 = curr;
  if (psVar1 == (string_view *)0x0) {
    sVar6 = IString::interned((IString *)0xe,(string_view)ZEXT816(0xbc5835),SUB81(in_RCX,0));
  }
  else {
    in_RCX = (Function *)psVar1->_M_len;
    sVar6 = *psVar1;
  }
  local_48 = (ostream *)sVar6._M_len;
  right.id = (local_38->type).id;
  Visitor<wasm::ReFinalizeNode,_void>::visit
            ((Visitor<wasm::ReFinalizeNode,_void> *)&local_200,local_38);
  left.id = (local_38->type).id;
  if (left.id == right.id) goto LAB_009dc2a0;
  bVar5 = false;
  if (((ulong)local_38->_id < 0x32) &&
     (in_RCX = (Function *)0x200000000000e, bVar5 = false,
     (0x200000000000eU >> ((ulong)local_38->_id & 0x3f) & 1) != 0)) {
    bVar5 = left.id == 1 && 1 < right.id;
  }
  bVar3 = wasm::Type::isSubType(left,right);
  if (bVar3) {
    if (left.id == 1 && !bVar5) {
LAB_009dc181:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"stale type found in ",0x14);
      name.super_IString.str._M_str = (char *)in_RCX;
      name.super_IString.str._M_len = (size_t)sVar6._M_str;
      poVar4 = wasm::operator<<((wasm *)&local_200,local_48,name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," on ",4);
      poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n(marked as ",0xc);
      poVar4 = wasm::operator<<(poVar4,right);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
      poVar4 = wasm::operator<<(poVar4,left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      pVVar2 = *(ValidationInfo **)((long)this + 0xd8);
      std::__cxx11::stringbuf::str();
      in_RCX = *(Function **)((long)this + 200);
      ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>(pVVar2,&local_88,local_38,in_RCX)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
      std::ios_base::~ios_base(local_190);
    }
  }
  else if (!bVar5) goto LAB_009dc181;
  (local_38->type).id = right.id;
LAB_009dc2a0:
  local_200 = (_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)((long)this + 0xe0);
  pVar7 = std::
          _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::Expression*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                    (local_200,&local_38);
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,"expression seen more than once in the tree in ",0x2e);
    name_00.super_IString.str._M_str = (char *)in_RCX;
    name_00.super_IString.str._M_len = (size_t)sVar6._M_str;
    poVar4 = wasm::operator<<((wasm *)&local_200,local_48,name_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," on ",4);
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    local_39 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_39,1);
    pVVar2 = *(ValidationInfo **)((long)this + 0xd8);
    std::__cxx11::stringbuf::str();
    ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>
              (pVVar2,&local_68,local_38,*(Function **)((long)this + 200));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
    std::ios_base::~ios_base(local_190);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      auto scope = getFunction() ? getFunction()->name : Name("(global scope)");
      // check if a node type is 'stale', i.e., we forgot to finalize() the
      // node.
      auto oldType = curr->type;
      ReFinalizeNode().visit(curr);
      auto newType = curr->type;
      if (newType != oldType) {
        // We accept concrete => undefined on control flow structures:
        // e.g.
        //
        //  (drop (block (result i32) (unreachable)))
        //
        // The block has a type annotated on it, which can make its unreachable
        // contents have a concrete type. Refinalize will make it unreachable,
        // so both are valid here.
        bool validControlFlowStructureChange =
          Properties::isControlFlowStructure(curr) && oldType.isConcrete() &&
          newType == Type::unreachable;
        // It's ok in general for types to get refined as long as they don't
        // become unreachable.
        bool validRefinement =
          Type::isSubType(newType, oldType) && newType != Type::unreachable;
        if (!validRefinement && !validControlFlowStructureChange) {
          std::ostringstream ss;
          ss << "stale type found in " << scope << " on " << curr
             << "\n(marked as " << oldType << ", should be " << newType
             << ")\n";
          info.fail(ss.str(), curr, getFunction());
        }
        curr->type = oldType;
      }
      // check if a node is a duplicate - expressions must not be seen more than
      // once
      if (!seen.insert(curr).second) {
        std::ostringstream ss;
        ss << "expression seen more than once in the tree in " << scope
           << " on " << curr << '\n';
        info.fail(ss.str(), curr, getFunction());
      }
    }